

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

void Abc_ObjTransferFanout(Abc_Obj_t *pNodeFrom,Abc_Obj_t *pNodeTo)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  int iVar4;
  long lVar5;
  
  if (((ulong)pNodeFrom & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeFrom)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0x128,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (((ulong)pNodeTo & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeTo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0x129,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
  }
  uVar2 = *(uint *)&pNodeFrom->field_0x14 & 0xf;
  if ((uVar2 == 3) || ((*(uint *)&pNodeTo->field_0x14 & 0xf) == 3)) {
    __assert_fail("!Abc_ObjIsPo(pNodeFrom) && !Abc_ObjIsPo(pNodeTo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0x12a,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pNodeFrom->pNtk != pNodeTo->pNtk) {
    __assert_fail("pNodeFrom->pNtk == pNodeTo->pNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,299,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pNodeFrom != pNodeTo) {
    if ((uVar2 == 7) && ((pNodeFrom->vFanouts).nSize < 1)) {
      __assert_fail("!Abc_ObjIsNode(pNodeFrom) || Abc_ObjFanoutNum(pNodeFrom) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                    ,0x12d,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
    }
    iVar1 = (pNodeTo->vFanouts).nSize;
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = 8;
    if (6 < iVar1 - 1U) {
      iVar4 = iVar1;
    }
    vNodes->nSize = 0;
    vNodes->nCap = iVar4;
    if (iVar4 == 0) {
      ppvVar3 = (void **)0x0;
    }
    else {
      ppvVar3 = (void **)malloc((long)iVar4 << 3);
    }
    vNodes->pArray = ppvVar3;
    Abc_NodeCollectFanouts(pNodeFrom,vNodes);
    for (lVar5 = 0; lVar5 < vNodes->nSize; lVar5 = lVar5 + 1) {
      Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar5],pNodeFrom,pNodeTo);
    }
    if ((pNodeFrom->vFanouts).nSize == 0) {
      if ((pNodeTo->vFanouts).nSize == vNodes->nSize + iVar1) {
        free(vNodes->pArray);
        free(vNodes);
        return;
      }
      __assert_fail("Abc_ObjFanoutNum(pNodeTo) == nFanoutsOld + vFanouts->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                    ,0x136,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
    }
    __assert_fail("Abc_ObjFanoutNum(pNodeFrom) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                  ,0x135,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
  }
  __assert_fail("pNodeFrom != pNodeTo",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanio.c"
                ,300,"void Abc_ObjTransferFanout(Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjTransferFanout( Abc_Obj_t * pNodeFrom, Abc_Obj_t * pNodeTo )
{
    Vec_Ptr_t * vFanouts;
    int nFanoutsOld, i;
    assert( !Abc_ObjIsComplement(pNodeFrom) );
    assert( !Abc_ObjIsComplement(pNodeTo) );
    assert( !Abc_ObjIsPo(pNodeFrom) && !Abc_ObjIsPo(pNodeTo) );
    assert( pNodeFrom->pNtk == pNodeTo->pNtk );
    assert( pNodeFrom != pNodeTo );
    assert( !Abc_ObjIsNode(pNodeFrom) || Abc_ObjFanoutNum(pNodeFrom) > 0 );
    // get the fanouts of the old node
    nFanoutsOld = Abc_ObjFanoutNum(pNodeTo);
    vFanouts = Vec_PtrAlloc( nFanoutsOld );
    Abc_NodeCollectFanouts( pNodeFrom, vFanouts );
    // patch the fanin of each of them
    for ( i = 0; i < vFanouts->nSize; i++ )
        Abc_ObjPatchFanin( (Abc_Obj_t *)vFanouts->pArray[i], pNodeFrom, pNodeTo );
    assert( Abc_ObjFanoutNum(pNodeFrom) == 0 );
    assert( Abc_ObjFanoutNum(pNodeTo) == nFanoutsOld + vFanouts->nSize );
    Vec_PtrFree( vFanouts );
}